

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::applyFilenamesAsTags(IConfig *config)

{
  char *pcVar1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *this;
  TestCase *pTVar2;
  const_reference testCaseInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0 [32];
  long local_c0;
  size_type lastDot;
  long local_98;
  size_type lastSlash;
  allocator local_79;
  undefined1 local_78 [8];
  string filename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  TestCase *test;
  size_t i;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *tests;
  IConfig *config_local;
  
  this = getAllTestCasesSorted(config);
  test = (TestCase *)0x0;
  while( true ) {
    pTVar2 = (TestCase *)std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(this);
    if (pTVar2 <= test) break;
    testCaseInfo = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::operator[]
                             (this,(size_type)test);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&filename.field_2 + 8),&(testCaseInfo->super_TestCaseInfo).tags);
    pcVar1 = (testCaseInfo->super_TestCaseInfo).lineInfo.file;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_78,pcVar1,&local_79);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_98 = std::__cxx11::string::find_last_of(local_78,0x196b57);
    if (local_98 != -1) {
      std::__cxx11::string::substr((ulong)&lastDot,(ulong)local_78);
      std::__cxx11::string::operator=((string *)local_78,(string *)&lastDot);
      std::__cxx11::string::~string((string *)&lastDot);
    }
    local_c0 = std::__cxx11::string::find_last_of(local_78,0x19b841);
    if (local_c0 != -1) {
      std::__cxx11::string::substr((ulong)local_e0,(ulong)local_78);
      std::__cxx11::string::operator=((string *)local_78,local_e0);
      std::__cxx11::string::~string(local_e0);
    }
    std::operator+(&local_100,"#",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&filename.field_2 + 8),&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    setTags(&testCaseInfo->super_TestCaseInfo,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&filename.field_2 + 8));
    std::__cxx11::string::~string((string *)local_78);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&filename.field_2 + 8));
    test = (TestCase *)&(test->super_TestCaseInfo).name.field_0x1;
  }
  return;
}

Assistant:

void applyFilenamesAsTags( IConfig const& config ) {
        std::vector<TestCase> const& tests = getAllTestCasesSorted( config );
        for(std::size_t i = 0; i < tests.size(); ++i ) {
            TestCase& test = const_cast<TestCase&>( tests[i] );
            std::set<std::string> tags = test.tags;

            std::string filename = test.lineInfo.file;
            std::string::size_type lastSlash = filename.find_last_of( "\\/" );
            if( lastSlash != std::string::npos )
                filename = filename.substr( lastSlash+1 );

            std::string::size_type lastDot = filename.find_last_of( "." );
            if( lastDot != std::string::npos )
                filename = filename.substr( 0, lastDot );

            tags.insert( "#" + filename );
            setTags( test, tags );
        }
    }